

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cmTarget *pcVar5;
  char *test;
  char **ppcVar6;
  char **ppcVar7;
  ostream *poVar8;
  byte bVar9;
  bool bVar10;
  byte local_29f;
  byte local_29e;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  cmTarget *local_298;
  char **local_290;
  string local_288;
  ostringstream e;
  cmStrCmp local_f0;
  cmStrCmp local_d0;
  cmStrCmp local_b0;
  cmStrCmp local_90;
  cmStrCmp local_70;
  cmStrCmp local_50;
  
  needCxx98 = false;
  needCxx11 = false;
  needCxx14 = false;
  needCxx17 = false;
  CheckNeededCxxLanguage(this,feature,&needCxx98,&needCxx11,&needCxx14,&needCxx17);
  std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_288);
  test = cmTarget::GetProperty(target,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  local_298 = target;
  if (test == (char *)0x0) {
    ppcVar6 = (char **)&cmMakefileTargetGenerator::vtable;
  }
  else {
    cmStrCmp::cmStrCmp(&local_50,test);
    ppcVar6 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (ppcVar6 == (char **)&cmMakefileTargetGenerator::vtable) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"The CXX_STANDARD property on target \"");
      poVar8 = std::operator<<(poVar8,(string *)&target->Name);
      poVar8 = std::operator<<(poVar8,"\" contained an invalid value: \"");
      poVar8 = std::operator<<(poVar8,test);
      std::operator<<(poVar8,"\".");
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_288,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_288);
      }
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
    cmStrCmp::cmStrCmp(&local_70,test);
    ppcVar6 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  bVar4 = needCxx98;
  bVar3 = needCxx11;
  bVar2 = needCxx14;
  bVar1 = needCxx17;
  bVar10 = test == (char *)0x0;
  if ((!bVar10 & needCxx17) == 1) {
    local_290 = ppcVar6;
    cmStrCmp::cmStrCmp(&local_90,"17");
    ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ppcVar6 = local_290;
    if (ppcVar7 <= local_290) goto LAB_003c3065;
  }
  else {
LAB_003c3065:
    local_29f = bVar10 & bVar4;
    local_29e = bVar10 & bVar3;
    if (test == (char *)0x0 || bVar2 != true) {
LAB_003c30df:
      bVar9 = bVar10 & bVar2;
      if (test != (char *)0x0 && bVar3 == true) {
        cmStrCmp::cmStrCmp(&local_d0,"11");
        ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        if (ppcVar6 < ppcVar7) {
          local_29e = 1;
          goto LAB_003c3193;
        }
      }
      if (test != (char *)0x0 && bVar4 == true) {
        cmStrCmp::cmStrCmp(&local_f0,"98");
        ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        local_29f = local_29f | ppcVar6 < ppcVar7;
      }
    }
    else {
      local_290 = ppcVar6;
      cmStrCmp::cmStrCmp(&local_b0,"14");
      ppcVar7 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMakefileTargetGenerator::vtable,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      ppcVar6 = local_290;
      if (ppcVar7 <= local_290) goto LAB_003c30df;
      bVar9 = 1;
    }
LAB_003c3193:
    pcVar5 = local_298;
    if ((bVar1 & bVar10) == 0) {
      if (bVar9 == 0) {
        if (local_29e == 0) {
          if (local_29f == 0) {
            return true;
          }
          std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_288);
          cmTarget::SetProperty(pcVar5,(string *)&e,"98");
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::string((string *)&e,"CUDA_STANDARD",(allocator *)&local_288);
          cmTarget::SetProperty(pcVar5,(string *)&e,"98");
          std::__cxx11::string::~string((string *)&e);
          return true;
        }
        std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_288);
        cmTarget::SetProperty(pcVar5,(string *)&e,"11");
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::string((string *)&e,"CUDA_STANDARD",(allocator *)&local_288);
        cmTarget::SetProperty(pcVar5,(string *)&e,"11");
      }
      else {
        std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_288);
        pcVar5 = local_298;
        cmTarget::SetProperty(local_298,(string *)&e,"14");
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::string((string *)&e,"CUDA_STANDARD",(allocator *)&local_288);
        cmTarget::SetProperty(pcVar5,(string *)&e,"14");
      }
      goto LAB_003c3366;
    }
  }
  std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_288);
  pcVar5 = local_298;
  cmTarget::SetProperty(local_298,(string *)&e,"17");
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&e,"CUDA_STANDARD",(allocator *)&local_288);
  cmTarget::SetProperty(pcVar5,(string *)&e,"17");
LAB_003c3366:
  std::__cxx11::string::~string((string *)&e);
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard) {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                     cmStrCmp(existingCxxStandard)) ==
        cmArrayEnd(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                               this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCxxIt = existingCxxStandard
    ? std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard))
    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;
  bool setCxx17 = needCxx17 && !existingCxxStandard;

  if (needCxx17 && existingCxxStandard &&
      existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                   cmArrayEnd(CXX_STANDARDS),
                                   cmStrCmp("17"))) {
    setCxx17 = true;
  } else if (needCxx14 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("14"))) {
    setCxx14 = true;
  } else if (needCxx11 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("11"))) {
    setCxx11 = true;
  } else if (needCxx98 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("98"))) {
    setCxx98 = true;
  }

  if (setCxx17) {
    target->SetProperty("CXX_STANDARD", "17");
    target->SetProperty("CUDA_STANDARD", "17");
  } else if (setCxx14) {
    target->SetProperty("CXX_STANDARD", "14");
    target->SetProperty("CUDA_STANDARD", "14");
  } else if (setCxx11) {
    target->SetProperty("CXX_STANDARD", "11");
    target->SetProperty("CUDA_STANDARD", "11");
  } else if (setCxx98) {
    target->SetProperty("CXX_STANDARD", "98");
    target->SetProperty("CUDA_STANDARD", "98");
  }
  return true;
}